

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

int arkInterpEvaluate_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tau,int deriv,int degree,
              N_Vector yout)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  sunrealtype sVar8;
  sunrealtype sVar9;
  sunrealtype p;
  double t;
  N_Vector X [6];
  undefined8 auStack_88 [6];
  undefined8 auStack_58 [6];
  
  pvVar3 = I->content;
  uVar2 = *(uint *)((long)pvVar3 + 0x18);
  iVar6 = 0;
  if (0 < degree) {
    iVar6 = degree;
  }
  if ((int)(uVar2 - 1) <= iVar6) {
    iVar6 = uVar2 - 1;
  }
  if ((uint)deriv < 4) {
    if (iVar6 < deriv) {
      N_VConst(0,yout);
    }
    else {
      puVar4 = *(undefined8 **)((long)pvVar3 + 8);
      if (iVar6 == 0) {
        N_VScale(0x3ff0000000000000,*puVar4,yout);
      }
      else {
        pdVar5 = *(double **)((long)pvVar3 + 0x10);
        dVar1 = *pdVar5;
        t = tau * (dVar1 - pdVar5[1]) + dVar1;
        if (iVar6 != 1) {
          if (0 < (int)uVar2) {
            ark_mem = (ARKodeMem_conflict)0x0;
            do {
              auStack_88[(long)ark_mem] = 0;
              auStack_58[(long)ark_mem] = puVar4[(long)ark_mem];
              ark_mem = (ARKodeMem_conflict)((long)&ark_mem->sunctx + 1);
            } while ((ARKodeMem_conflict)(ulong)(iVar6 + 1) != ark_mem);
          }
          iVar6 = (*(code *)(&DAT_00163fec + *(int *)(&DAT_00163fec + (ulong)(uint)deriv * 4)))
                            (ark_mem,&DAT_00163fec,
                             &DAT_00163fec + *(int *)(&DAT_00163fec + (ulong)(uint)deriv * 4));
          return iVar6;
        }
        if (deriv == 0) {
          if ((int)uVar2 < 1) {
            sVar9 = 1.0;
            sVar8 = 1.0;
          }
          else {
            sVar8 = 1.0;
            uVar7 = 0;
            do {
              if (uVar7 != 0) {
                sVar8 = sVar8 * ((t - pdVar5[uVar7]) / (dVar1 - pdVar5[uVar7]));
              }
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
            sVar9 = 1.0;
            uVar7 = 0;
            do {
              if (uVar7 != 1) {
                sVar9 = sVar9 * ((t - pdVar5[uVar7]) / (pdVar5[1] - pdVar5[uVar7]));
              }
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
        }
        else {
          sVar8 = LBasisD(I,0,t);
          sVar9 = LBasisD(I,1,t);
        }
        N_VLinearSum(sVar8,sVar9,*puVar4,puVar4[1],yout);
      }
    }
    iVar6 = 0;
  }
  else {
    iVar6 = -0x16;
    arkProcessError(ark_mem,-0x16,0x4bf,"arkInterpEvaluate_Lagrange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_interp.c"
                    ,"Requested illegal derivative.");
  }
  return iVar6;
}

Assistant:

int arkInterpEvaluate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tau,
                               int deriv, int degree, N_Vector yout)
{
  /* local variables */
  int q, retval, i, j;
  sunrealtype tval;
  sunrealtype a[6];
  N_Vector X[6];
  int nhist;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* determine polynomial degree q */
  q = SUNMAX(degree, 0);    /* respect lower bound */
  q = SUNMIN(q, nhist - 1); /* respect max possible */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                     "ARKODE::arkInterpEvaluate_Lagrange", "interp-eval",
                     "tau = %" RSYM ", d = %i, q = %i", tau, deriv, q);
#endif

  /* error on illegal deriv */
  if ((deriv < 0) || (deriv > 3))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if deriv is too high, just return zeros */
  if (deriv > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* if constant interpolant is requested, just return ynew */
  if (q == 0)
  {
    N_VScale(ONE, yhist[0], yout);
    return (ARK_SUCCESS);
  }

  /* convert from tau back to t (both tnew and told are valid since q>0 => NHIST>1) */
  tval = thist[0] + tau * (thist[0] - thist[1]);

  /* linear interpolant */
  if (q == 1)
  {
    if (deriv == 0)
    {
      a[0] = LBasis(I, 0, tval);
      a[1] = LBasis(I, 1, tval);
    }
    else
    { /* deriv == 1 */
      a[0] = LBasisD(I, 0, tval);
      a[1] = LBasisD(I, 1, tval);
    }
    N_VLinearSum(a[0], yhist[0], a[1], yhist[1], yout);
    return (ARK_SUCCESS);
  }

  /* higher-degree interpolant */
  /*    initialize arguments for N_VLinearCombination */
  for (i = 0; i < q + 1; i++)
  {
    a[i] = ZERO;
    X[i] = yhist[i];
  }

  /*    construct linear combination coefficients based on derivative requested */
  switch (deriv)
  {
  case (0): /* p(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasis(I, j, tval); }
    break;

  case (1): /* p'(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD(I, j, tval); }
    break;

  case (2): /* p''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD2(I, j, tval); }
    break;

  case (3): /* p'''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD3(I, j, tval); }
    break;
  }

  /*    call N_VLinearCombination to evaluate the result, and return */
  retval = N_VLinearCombination(q + 1, a, X, yout);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  return (ARK_SUCCESS);
}